

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeValidJointActionExtensions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs)

{
  undefined4 uVar1;
  type this_00;
  size_t sVar2;
  shared_ptr<BGIP_BnB_Node> *in_RSI;
  BGIP_BnB_NodePtr *in_stack_00000028;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000030;
  Index in_stack_0000003c;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_00000040;
  Index jt_bgI;
  Index jt_oI;
  undefined4 in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15828e);
  this_00 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
  sVar2 = BGIP_BnB_Node::GetDepth(this_00);
  uVar1 = (undefined4)sVar2;
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
            ((shared_ptr<BGIP_BnB_Node> *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
             (shared_ptr<BGIP_BnB_Node> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  GetJTIndexMapping((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                    CONCAT44(uVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                    (BGIP_BnB_NodePtr *)0x1582d3);
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1582e1);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
            ((shared_ptr<BGIP_BnB_Node> *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
             (shared_ptr<BGIP_BnB_Node> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ComputeValidJointActions(in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028);
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x158336);
  return;
}

Assistant:

void 
    ComputeValidJointActionExtensions(BGIP_BnB_NodePtr node, 
                                      std::vector<Index>& valid_JAs){
    // a std::vector containing all valid joint actions
    //std::vector<Index> valid_JAs;
    valid_JAs.clear();
    // the joint type we are currently considering
    // *node* specifies jt_oI =  node->GetDepth() - 1
    // so its child specifies jt_oI =  node->GetDepth()
    Index jt_oI = node->GetDepth();
    Index jt_bgI=GetJTIndexMapping(jt_oI, node);

#if DEBUG_VALID_ACTIONS            
    std::cout << "\tComputing valid JAs for the "<<jt_oI<<"th joint type, corr. to jt_bgI"<<jt_bgI<<std::endl;
#endif
    ComputeValidJointActions(jt_bgI, valid_JAs, node);
#if CHECK_VALID_JA        
    std::vector<Index> control_JAs;
    ComputeValidJointActionsOld(node, jt_bgI, control_JAs);
    std::sort( valid_JAs.begin(), valid_JAs.end());
    std::sort( control_JAs.begin(), control_JAs.end());
    if(! VectorTools::Equal(valid_JAs, control_JAs) )
    {
        std::cout <<"BGIP_SolverBranchAndBound WARNING!!! valid joint actions not equal!!!"<<std::endl
                  << "valid_JAs="<< SoftPrintVector(valid_JAs) << std::endl
                  << "control_JAs="<< SoftPrintVector(control_JAs) << std::endl;
    }
    else
        std::cout << "BGIP_SolverBranchAndBound Valid joint actions equal: "<< 
            SoftPrintVector(valid_JAs) << std::endl;
#endif
    
}